

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O1

void __thiscall TcpSocketTest::test1(TcpSocketTest *this)

{
  int iVar1;
  Address server_addr;
  timespec t;
  ServerSocket server;
  ServerSocket server2;
  Socket sock;
  Selector s;
  char local_41c [16];
  undefined4 local_40c;
  timespec local_3f8;
  timespec local_3e0;
  Address local_3d0 [3];
  ServerSocket local_360 [112];
  Socket local_2f0 [112];
  Selector local_280 [632];
  
  this->no_echo = true;
  Selector::Selector(local_280,"TcpSelector");
  JetHead::Socket::Socket(local_2f0,true);
  JetHead::ServerSocket::ServerSocket((ServerSocket *)local_3d0,true);
  JetHead::ServerSocket::ServerSocket(local_360,true);
  local_41c[0] = '\x02';
  local_41c[1] = '\0';
  local_41c[2] = '\0';
  local_41c[3] = '\0';
  local_41c[4] = '\0';
  local_41c[5] = '\0';
  local_41c[6] = '\0';
  local_41c[7] = '\0';
  local_40c = 0x10;
  iVar1 = JetHead::ServerSocket::bind(local_3d0);
  if (iVar1 == -1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x180,"Bind Failed.");
  }
  iVar1 = JetHead::ServerSocket::listen((int)local_3d0);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x188,"ListenFailed");
  }
  JetHead::Socket::getLocalAddress(local_3d0);
  JetHead::Socket::Address::setAddress(local_41c);
  JetHead::Socket::setSelector((SocketListener *)local_3d0,(Selector *)&this->super_SocketListener);
  local_3f8.tv_sec = 0;
  local_3f8.tv_nsec = 0;
  local_3e0.tv_sec = 0;
  local_3e0.tv_nsec = 10000000;
  nanosleep(&local_3e0,&local_3f8);
  this->no_echo = false;
  JetHead::ServerSocket::~ServerSocket(local_360);
  JetHead::ServerSocket::~ServerSocket((ServerSocket *)local_3d0);
  JetHead::Socket::~Socket(local_2f0);
  Selector::~Selector(local_280);
  return;
}

Assistant:

void TcpSocketTest::test1()
{

  no_echo = true;
  Selector s( "TcpSelector" );
  Socket sock;
  ServerSocket server;
  ServerSocket server2;
  Socket::Address server_addr, server_addr2, client_addr;
  int res;
  char buf[BUF_SIZE];
  for( int i = 0; i < BUF_SIZE; i++)
    buf[i] = 'A';
  
  
  
  // This crashes the program. 
  // res = server.write(buf, BUF_SIZE);
  //if( res != -1 )
  //TestFailed("Writing no where should fail");
  
  
  
  res = server.bind(server_addr);
  if( res == -1 )
    TestFailed("Bind Failed.");
  
  // res = server.write(buf, BUF_SIZE);
  //if( res != -1 )
  //TestFailed("Writing no where should fail");
  
  res = server.listen(1);
  if ( res < 0 )
    TestFailed("ListenFailed");
  
  //res = server.write(buf, BUF_SIZE);
  //if( res != -1 )
  //  TestFailed("Writing no where should fail");
  
  res = server.getLocalAddress( server_addr );
  server_addr.setAddress( "127.0.0.1" );
  
  // UNCOMMENT TO PALY ECHO cerr << "Server name " <<  server_addr.getName() << " "<<  server_addr.getPort() << endl;
  
  server.setSelector( this, mSelector );

  //res = sock.connect( server_addr );
  //cout << "In echo mode." << endl;
  
  struct timespec t,tt;
  t.tv_sec = tt.tv_sec = tt.tv_nsec = 0;
  t.tv_nsec = 10000000;
  res = nanosleep( &t, &tt );
 
  
  
  no_echo = false;
  //cout << "Out of echo mode." << endl;

    
}